

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::file_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_baryonyx::file_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,quadratic_cost_type<long_double> *original_costs,
            double cost_constant)

{
  init_policy_type iVar1;
  context *this_00;
  context *ctx;
  bool bVar2;
  undefined8 uVar3;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> P;
  unique_ptr<long_double[],_std::default_delete<long_double[]>_> uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  rep rVar9;
  undefined8 extraout_RAX;
  long lVar10;
  result_status rVar11;
  random_engine *rng;
  int iVar12;
  long lVar13;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  int in_R9D;
  ulong uVar14;
  longdouble in_ST0;
  longdouble theta;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar16;
  longdouble in_ST5;
  longdouble lVar17;
  longdouble lVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  string_view filename;
  bit_array x;
  quadratic_cost_type<long_double> norm_costs;
  compute_order compute;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  slv;
  file_observer obs;
  bit_array_impl local_510;
  uint local_4fc;
  quadratic_cost_type<long_double> *local_4f8;
  double local_4f0;
  ulong local_4e8;
  int local_4dc;
  longdouble local_4d8;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  longdouble local_4bc;
  longdouble local_4b0;
  longdouble local_4a4;
  quadratic_cost_type<long_double> local_498;
  double local_478;
  double local_470;
  compute_order local_468;
  longdouble local_430;
  longdouble local_424;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  local_418;
  undefined1 local_288 [256];
  ios_base local_188 [264];
  ap_file_observer local_80;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_4f0 = cost_constant;
  bit_array_impl::bit_array_impl(&local_510,variables);
  this_00 = this->m_ctx;
  normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
            (&local_498,(itm *)this_00,(context *)original_costs,
             (quadratic_cost_type<long_double> *)this->m_rng,(random_engine *)(ulong)(uint)variables
             ,in_R9D);
  local_4b0 = (longdouble)(this_00->parameters).kappa_step;
  local_4a4 = (longdouble)(this_00->parameters).kappa_max;
  local_4bc = (longdouble)(this_00->parameters).alpha;
  theta = (longdouble)(this_00->parameters).theta;
  dVar20 = (this_00->parameters).delta;
  if (0.0 <= dVar20) {
    local_4d8 = (longdouble)dVar20;
    local_470 = dVar20;
  }
  else {
    ctx = this->m_ctx;
    local_288._0_8_ = SUB108(theta,0);
    local_288._8_2_ = (undefined2)((unkuint10)theta >> 0x40);
    lVar15 = in_ST5;
    info<>(ctx,"  - delta not defined, compute it:\n");
    quadratic_cost_type<long_double>::min(&local_498,variables);
    local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = in_ST0 - (longdouble)CONCAT28(local_288._8_2_,local_288._0_8_) * in_ST0;
    info<long_double,long_double,long_double>
              (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",(longdouble *)&local_468,
               (longdouble *)&local_418,(longdouble *)local_288);
    local_4d8 = (longdouble)
                local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._0_10_;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar15;
  }
  local_424 = (longdouble)(this_00->parameters).pushing_k_factor;
  local_430 = (longdouble)(this_00->parameters).pushing_objective_amplifier;
  local_4e8 = (ulong)(this_00->parameters).w;
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  ::solver_inequalities_Zcoeff
            (&local_418,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_498,constraints);
  compute_order::compute_order(&local_468,(this_00->parameters).order,variables);
  dVar20 = (this->m_ctx->parameters).init_policy_random;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  local_288._8_2_ = 0;
  local_288._10_6_ = 0;
  iVar1 = (this_00->parameters).init_policy;
  if (iVar1 == bastert) {
    init_with_bastert<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_510,original_costs,variables,0);
  }
  else {
    if (iVar1 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_510;
      x_optimistic = (bit_array_impl *)local_288;
    }
    else {
      if (iVar1 != optimistic_solve) goto LAB_005b04f1;
      rng = this->m_rng;
      x_pessimistic = (bit_array_impl *)local_288;
      x_optimistic = &local_510;
    }
    init_with_pre_solve<baryonyx::itm::quadratic_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_005b04f1:
  local_4f8 = original_costs;
  if (local_510.m_size != 0) {
    iVar12 = 0;
    do {
      dVar19 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar19 < dVar20) {
        bit_array_impl::invert(&local_510,iVar12);
      }
      iVar12 = iVar12 + 1;
    } while (local_510.m_size != iVar12);
  }
  if ((void *)CONCAT62(local_288._10_6_,local_288._8_2_) != (void *)0x0) {
    operator_delete__((void *)CONCAT62(local_288._10_6_,local_288._8_2_));
  }
  dVar20 = (this_00->parameters).kappa_min;
  filename._M_str = "img";
  filename._M_len = 3;
  file_observer::file_observer
            ((file_observer *)local_288,filename,local_418.m,local_418.n,(this_00->parameters).limit
            );
  lVar15 = (longdouble)dVar20;
  local_478 = dVar20;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar9;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar9;
  compute_order::
  init<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array>
            (&local_468,&local_418,(bit_array *)&local_510);
  local_4dc = variables;
  if ((this_00->parameters).limit == 0) {
    uVar6 = 0;
  }
  else {
    iVar12 = 0x7fffffff;
    lVar13 = 0;
    local_4fc = 0;
    do {
      iVar5 = compute_order::
              run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        (&local_468,&local_418,(bit_array *)&local_510,this->m_rng,lVar15,local_4d8,
                         theta);
      uVar4._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           local_418.pi;
      P._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl =
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)
           (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)local_418.P
      ;
      details::pi_file_observer::make_observation<long_double>
                ((pi_file_observer *)local_288,&local_418.ap,
                 (longdouble *)
                 local_418.P._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl,
                 (longdouble *)
                 local_418.pi._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
      details::ap_file_observer::make_observation<long_double>
                (&local_80,&local_418.ap,
                 (longdouble *)
                 P._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
                 .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl,
                 (longdouble *)
                 uVar4._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
      if (iVar5 == 0) {
        dVar20 = quadratic_cost_type<long_double>::results
                           (local_4f8,(bit_array *)&local_510,local_4f0);
        store_if_better(this,(bit_array *)&local_510,dVar20,lVar13);
        iVar12 = 0;
        local_4fc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        bVar2 = false;
      }
      else {
        if (iVar5 < iVar12) {
          store_if_better(this,(bit_array *)&local_510,iVar5,lVar13);
          iVar12 = iVar5;
        }
        if ((long)local_4e8 < lVar13) {
          local_4c0 = local_418.m;
          local_4c4 = iVar5;
          powl();
          lVar15 = lVar15 + local_4b0 * in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
        }
        rVar11 = kappa_max_reached;
        in_ST5 = in_ST4;
        if (lVar15 <= local_4a4) {
          lVar10 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar10;
          dVar20 = (this->m_ctx->parameters).time_limit;
          bVar2 = true;
          if ((dVar20 <= 0.0) ||
             (rVar11 = time_limit_reached, bVar2 = true,
             (double)(lVar10 - (this->m_begin).__d.__r) / 1000000000.0 <= dVar20))
          goto LAB_005b07a2;
        }
        __return_storage_ptr__->status = rVar11;
        bVar2 = false;
      }
LAB_005b07a2:
      uVar6 = local_4fc;
    } while ((bVar2) && (lVar13 = lVar13 + 1, lVar13 != (this_00->parameters).limit));
  }
  if ((uVar6 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (this_00->parameters).pushes_limit) {
    iVar12 = 0;
    iVar5 = 0;
    do {
      lVar16 = in_ST3;
      lVar17 = in_ST3;
      iVar7 = compute_order::
              push_and_run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        (&local_468,&local_418,(bit_array *)&local_510,this->m_rng,
                         local_424 * lVar15,local_4d8,theta,local_430);
      if (iVar7 == 0) {
        dVar20 = quadratic_cost_type<long_double>::results
                           (local_4f8,(bit_array *)&local_510,local_4f0);
        store_if_better(this,(bit_array *)&local_510,dVar20,
                        (long)~((this_00->parameters).pushing_iteration_limit * iVar5));
      }
      lVar13 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar13;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar21._0_8_ = (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar21._8_8_ = in_XMM2_Qb;
      uVar3 = vcmppd_avx512vl(auVar22,ZEXT816(0),6);
      uVar14 = vcmppd_avx512vl(auVar22,auVar21,1);
      uVar14 = ((byte)uVar3 & 3) & uVar14;
      local_4e8 = CONCAT62(local_4e8._2_6_,(short)uVar14);
      if (((uVar14 & 1) == 0) && (0 < (this_00->parameters).pushing_iteration_limit)) {
        iVar7 = 1;
        while (iVar8 = compute_order::
                       run<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                                 (&local_468,&local_418,(bit_array *)&local_510,this->m_rng,lVar15,
                                  local_4d8,theta), iVar8 != 0) {
          if ((this_00->parameters).w < (double)(iVar7 + -1)) {
            local_4c8 = local_418.m;
            lVar18 = lVar17;
            local_4cc = iVar8;
            powl();
            lVar15 = lVar15 + local_4b0 * in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = lVar16;
            lVar16 = lVar17;
            lVar17 = lVar18;
          }
          if (local_4a4 < lVar15) goto LAB_005b0a35;
          lVar13 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar13;
          dVar20 = (this->m_ctx->parameters).time_limit;
          if (((0.0 < dVar20) &&
              (dVar20 < (double)(lVar13 - (this->m_begin).__d.__r) / 1000000000.0)) ||
             (bVar2 = (this_00->parameters).pushing_iteration_limit <= iVar7, iVar7 = iVar7 + 1,
             bVar2)) goto LAB_005b0a35;
        }
        dVar20 = quadratic_cost_type<long_double>::results
                           (local_4f8,(bit_array *)&local_510,local_4f0);
        store_if_better(this,(bit_array *)&local_510,dVar20,
                        (long)((this_00->parameters).pushing_iteration_limit * iVar12 - iVar7));
      }
LAB_005b0a35:
      if ((local_4e8 & 1) != 0) break;
      iVar5 = iVar5 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar5 < (this_00->parameters).pushes_limit);
  }
  iVar12 = local_4dc;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar12);
  }
  if (local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_value.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_basename._M_dataplus._M_p != &local_80.m_basename.field_2) {
    operator_delete(local_80.m_basename._M_dataplus._M_p,
                    local_80.m_basename.field_2._M_allocated_capacity + 1);
  }
  local_288._8_2_ = (undefined2)_VTT;
  local_288._10_6_ = (undefined6)((ulong)_VTT >> 0x10);
  *(undefined8 *)(local_288 + *(long *)(_VTT + -0x18) + 8) = _log;
  std::filebuf::~filebuf((filebuf *)(local_288 + 0x10));
  std::ios_base::~ios_base(local_188);
  if (local_468.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
  ::~solver_inequalities_Zcoeff(&local_418);
  if ((__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
      local_498.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_498.indices._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_498.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
       )local_498.quadratic_elements._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>)0x0) {
    operator_delete__((void *)local_498.quadratic_elements._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>
                              ._M_head_impl);
  }
  local_498.quadratic_elements._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<long_double>::quad_*,_false>.
  _M_head_impl = (__uniq_ptr_data<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>,_true,_true>
                  )(__uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<long_double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<long_double>::quad[]>_>
                    )0x0;
  if ((_Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>)
      local_498.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl != (longdouble *)0x0) {
    operator_delete__((void *)local_498.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_unsigned_long_*,_false>)
      local_510.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_510.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }